

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strand_service.hpp
# Opt level: O0

void __thiscall
asio::detail::strand_service::on_dispatch_exit::~on_dispatch_exit(on_dispatch_exit *this)

{
  bool bVar1;
  bool more_handlers;
  on_dispatch_exit *this_local;
  
  posix_mutex::lock(&this->impl_->mutex_);
  op_queue<asio::detail::scheduler_operation>::push<asio::detail::scheduler_operation>
            (&this->impl_->ready_queue_,&this->impl_->waiting_queue_);
  bVar1 = op_queue<asio::detail::scheduler_operation>::empty(&this->impl_->ready_queue_);
  this->impl_->locked_ = (bool)((bVar1 ^ 0xffU) & 1);
  posix_mutex::unlock(&this->impl_->mutex_);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    scheduler::post_immediate_completion(this->io_context_impl_,&this->impl_->super_operation,false)
    ;
  }
  return;
}

Assistant:

~on_dispatch_exit()
  {
    impl_->mutex_.lock();
    impl_->ready_queue_.push(impl_->waiting_queue_);
    bool more_handlers = impl_->locked_ = !impl_->ready_queue_.empty();
    impl_->mutex_.unlock();

    if (more_handlers)
      io_context_impl_->post_immediate_completion(impl_, false);
  }